

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int whereLoopAddVirtual(WhereLoopBuilder *pBuilder,Bitmask mPrereq,Bitmask mUnusable)

{
  char *pcVar1;
  byte *pbVar2;
  sqlite3_index_orderby *psVar3;
  byte bVar4;
  byte bVar5;
  ushort uVar6;
  WhereInfo *pWVar7;
  WhereClause *pWVar8;
  Parse *pParse;
  SrcList *pSVar9;
  WhereLoop *p;
  ExprList *pEVar10;
  Table *pTVar11;
  Expr *pEVar12;
  u16 mNoOmit;
  int iVar13;
  char *pcVar14;
  sqlite3_index_info *pIdxInfo;
  ulong uVar15;
  bool bVar16;
  WhereClause *pWVar17;
  long lVar18;
  long lVar19;
  char *pcVar20;
  Index *pIVar21;
  uint uVar22;
  Expr *pEVar23;
  ulong uVar24;
  uint uVar25;
  int iVar26;
  int iVar27;
  ulong uVar28;
  Bitmask *pBVar29;
  ulong uVar30;
  ulong uVar31;
  int iVar32;
  ulong uVar33;
  anon_union_8_3_bb5b150a_for_u *paVar34;
  long lVar35;
  u8 uVar36;
  ushort uVar37;
  sqlite3_index_constraint *psVar38;
  uint uVar39;
  uint uVar40;
  ulong uVar41;
  long in_FS_OFFSET;
  bool bVar42;
  ulong local_98;
  int bRetry;
  int bIn;
  Walker local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bIn = -0x55555556;
  bRetry = 0;
  pWVar7 = pBuilder->pWInfo;
  pWVar8 = pBuilder->pWC;
  pParse = pWVar7->pParse;
  pSVar9 = pWVar7->pTabList;
  p = pBuilder->pNew;
  bVar4 = p->iTab;
  pEVar10 = pWVar7->pOrderBy;
  pTVar11 = pSVar9->a[bVar4].pSTab;
  if (pWVar8 == (WhereClause *)0x0) {
    lVar18 = 0;
  }
  else {
    iVar13 = 0;
    pWVar17 = pWVar8;
    do {
      iVar26 = pWVar17->nTerm;
      if (0 < iVar26) {
        iVar27 = pSVar9->a[bVar4].iCursor;
        pBVar29 = &pWVar17->a->prereqRight;
        do {
          uVar6 = *(u16 *)((long)pBVar29 + -0x16);
          *(ushort *)((long)pBVar29 + -0x16) = uVar6 & 0xffbf;
          if (((*(int *)((long)pBVar29 + -0xc) == iVar27) && ((*pBVar29 & mUnusable) == 0)) &&
             (-1 < (char)uVar6 && (*pBVar29 & 0xf7ff00000000) != 0)) {
            bVar5 = pSVar9->a[bVar4].fg.jointype;
            if ((bVar5 & 0x58) != 0) {
              uVar40 = ((WhereTerm *)(pBVar29 + -5))->pExpr->flags;
              if ((((uVar40 & 3) == 0) ||
                  ((((WhereTerm *)(pBVar29 + -5))->pExpr->w).iJoin != iVar27)) ||
                 (((bVar5 & 0x18) != 0 && ((uVar40 & 2) != 0)))) goto LAB_0019b6f8;
            }
            iVar13 = iVar13 + 1;
            *(ushort *)((long)pBVar29 + -0x16) = uVar6 | 0x40;
          }
LAB_0019b6f8:
          pBVar29 = pBVar29 + 7;
          iVar26 = iVar26 + -1;
        } while (iVar26 != 0);
      }
      pWVar17 = pWVar17->pOuter;
    } while (pWVar17 != (WhereClause *)0x0);
    lVar18 = (long)iVar13;
  }
  uVar25 = 0;
  uVar40 = 0;
  if (pEVar10 != (ExprList *)0x0) {
    uVar22 = pEVar10->nExpr;
    uVar39 = 0;
    if (0 < (long)(int)uVar22) {
      uVar41 = 0;
      do {
        pEVar23 = pEVar10->a[uVar41].pExpr;
        local_68.u.pNC = (NameContext *)&DAT_aaaaaaaaaaaaaaaa;
        local_68.xSelectCallback2 = (_func_void_Walker_ptr_Select_ptr *)&DAT_aaaaaaaaaaaaaaaa;
        local_68.walkerDepth = -0x55555556;
        local_68.eCode = 1;
        local_68.mWFlags = 0xaaaa;
        local_68.pParse = (Parse *)0x0;
        local_68.xExprCallback = exprNodeIsConstant;
        local_68.xSelectCallback = sqlite3SelectWalkFail;
        if (pEVar23 != (Expr *)0x0) {
          sqlite3WalkExprNN(&local_68,pEVar23);
        }
        iVar13 = 10;
        if (local_68.eCode == 0) {
          if ((pEVar10->a[uVar41].fg.sortFlags & 2) == 0) {
            if (pEVar23->op == 'r') {
              pEVar12 = pEVar23->pLeft;
              if ((pEVar12->op == 0xa8) && (pEVar12->iTable == pSVar9->a[bVar4].iCursor)) {
                pEVar23->iColumn = pEVar12->iColumn;
                lVar19 = (long)pEVar12->iColumn;
                if (lVar19 < 0) {
                  bVar16 = false;
                  iVar13 = 10;
                }
                else {
                  uVar6 = pTVar11->aCol[lVar19].colFlags;
                  if ((uVar6 >> 9 & 1) == 0) {
                    pcVar14 = (char *)0x0;
                  }
                  else {
                    pcVar14 = pTVar11->aCol[lVar19].zCnName + -1;
                    do {
                      pcVar20 = pcVar14 + 1;
                      pcVar14 = pcVar14 + 1;
                    } while (*pcVar20 != '\0');
                    pcVar20 = pcVar14;
                    if ((uVar6 & 4) != 0) {
                      do {
                        pcVar14 = pcVar20 + 1;
                        pcVar1 = pcVar20 + 1;
                        pcVar20 = pcVar14;
                      } while (*pcVar1 != '\0');
                    }
                    pcVar14 = pcVar14 + 1;
                  }
                  if ((pEVar23->u).zToken != (char *)0x0) {
                    if (pcVar14 == (char *)0x0) {
                      pcVar14 = "BINARY";
                    }
                    lVar19 = 0;
                    do {
                      bVar5 = (pEVar23->u).zToken[lVar19];
                      bVar42 = bVar5 == pcVar14[lVar19];
                      if (bVar42) {
                        if ((ulong)bVar5 == 0) goto LAB_0019b8cc;
                      }
                      else if (""[bVar5] != ""[(byte)pcVar14[lVar19]]) goto LAB_0019b8cc;
                      lVar19 = lVar19 + 1;
                    } while( true );
                  }
                  bVar42 = false;
LAB_0019b8cc:
                  bVar16 = (bool)(bVar42 ^ 1);
                  iVar13 = 0;
                  if (bVar42) {
                    iVar13 = 10;
                  }
                }
                if (!bVar16) goto LAB_0019b8ea;
              }
            }
            else if ((pEVar23->op == 0xa8) && (pEVar23->iTable == pSVar9->a[bVar4].iCursor))
            goto LAB_0019b8ea;
          }
          iVar13 = 8;
        }
LAB_0019b8ea:
        if (iVar13 != 10) goto LAB_0019b8fe;
        uVar41 = uVar41 + 1;
      } while (uVar41 != (long)(int)uVar22);
      uVar41 = (ulong)uVar22;
LAB_0019b8fe:
      uVar39 = (uint)uVar41;
    }
    uVar25 = 0;
    uVar40 = 0;
    if (uVar39 == uVar22) {
      uVar6 = pWVar7->wctrlFlags;
      uVar40 = uVar22;
      if (((char)uVar6 < '\0') && (-1 < *(short *)&pSVar9->a[bVar4].fg.field_0x1)) {
        uVar25 = uVar6 >> 9 & 1 | 2;
      }
      else {
        uVar25 = uVar6 >> 6 & 1;
      }
    }
  }
  lVar19 = (long)(int)uVar40;
  pIdxInfo = (sqlite3_index_info *)sqlite3DbMallocZero(pParse->db,lVar18 * 0x1c + lVar19 * 8 + 0x88)
  ;
  if (pIdxInfo == (sqlite3_index_info *)0x0) {
    pIdxInfo = (sqlite3_index_info *)0x0;
    sqlite3ErrorMsg(pParse,"out of memory");
    mNoOmit = 0xaaaa;
  }
  else {
    psVar38 = (sqlite3_index_constraint *)(&pIdxInfo[1].aConstraintUsage + lVar18);
    psVar3 = (sqlite3_index_orderby *)((long)&pIdxInfo[1].aConstraintUsage + lVar18 * 0x14);
    pIdxInfo->aConstraint = psVar38;
    pIdxInfo->aOrderBy = psVar3;
    pIdxInfo->aConstraintUsage = (sqlite3_index_constraint_usage *)(psVar3 + lVar19);
    uVar41 = pSVar9->a[bVar4].colUsed;
    pIdxInfo->colUsed = uVar41;
    if ((pTVar11->tabFlags & 0x80) != 0) {
      for (pIVar21 = pTVar11->pIndex;
          (pIVar21 != (Index *)0x0 && ((*(ushort *)&pIVar21->field_0x63 & 3) != 2));
          pIVar21 = pIVar21->pNext) {
      }
      if ((ulong)pIVar21->nKeyCol != 0) {
        uVar30 = 0;
        do {
          uVar24 = (ulong)(ushort)pIVar21->aiColumn[uVar30];
          if (0x3e < pIVar21->aiColumn[uVar30]) {
            uVar24 = 0x3f;
          }
          uVar41 = uVar41 | 1L << (uVar24 & 0x3f);
          uVar30 = uVar30 + 1;
        } while (pIVar21->nKeyCol != uVar30);
        pIdxInfo->colUsed = uVar41;
      }
    }
    iVar13 = 0;
    *(WhereClause **)(pIdxInfo + 1) = pWVar8;
    pIdxInfo[1].aConstraint = (sqlite3_index_constraint *)pParse;
    pIdxInfo[1].nOrderBy = uVar25;
    *(undefined4 *)&pIdxInfo[1].field_0x14 = 0;
    if (pWVar8 == (WhereClause *)0x0) {
      mNoOmit = 0;
      iVar26 = 0;
    }
    else {
      iVar27 = 0;
      iVar26 = 0;
      uVar25 = 0;
      pWVar17 = pWVar8;
      do {
        if (0 < pWVar17->nTerm) {
          iVar32 = pWVar17->nTerm + iVar27;
          paVar34 = &pWVar17->a->u;
          do {
            uVar6 = *(u16 *)((long)paVar34 + -0xe);
            if ((uVar6 & 0x40) != 0) {
              lVar35 = (long)iVar26;
              psVar38[lVar35].iColumn = (paVar34->x).leftColumn;
              (&pIdxInfo[1].idxNum)[lVar18 * 2 + lVar35 * 3] = iVar27;
              uVar37 = *(u16 *)((long)paVar34 + -0xc) & 0x3fff;
              if ((uVar37 == 1) && (uVar37 = 2, -1 < (short)uVar6)) {
                uVar22 = 1 << ((byte)iVar26 & 0x1f);
                if (0x1f < iVar26) {
                  uVar22 = 0;
                }
                *(uint *)&pIdxInfo[1].field_0x14 = *(uint *)&pIdxInfo[1].field_0x14 | uVar22;
              }
              if (uVar37 == 0x40) {
                uVar36 = *(u8 *)((long)paVar34 + -9);
LAB_0019baf5:
                psVar38[lVar35].op = uVar36;
              }
              else {
                if ((uVar37 & 0x180) != 0) {
                  uVar36 = 'H' - (uVar37 == 0x100);
                  goto LAB_0019baf5;
                }
                psVar38[lVar35].op = (uchar)uVar37;
                if ((uVar37 & 0x3c) != 0) {
                  pEVar23 = ((WhereTerm *)(paVar34 + -4))->pExpr->pRight;
                  uVar36 = pEVar23->op;
                  if (uVar36 == 0xb0) {
                    uVar36 = pEVar23->op2;
                  }
                  if (uVar36 != 0xb1) {
                    if (uVar36 != 0x8b) goto LAB_0019baf9;
                    pEVar23 = (Expr *)(pEVar23->x).pList;
                  }
                  if (1 < ((pEVar23->x).pList)->nExpr) {
                    uVar22 = 1 << ((byte)iVar26 & 0x1f);
                    if (0xf < iVar26) {
                      uVar22 = 0;
                    }
                    uVar25 = uVar25 | uVar22;
                    if (uVar37 == 0x10) {
                      uVar36 = '\b';
                    }
                    else {
                      if (uVar37 != 4) goto LAB_0019baf9;
                      uVar36 = ' ';
                    }
                    goto LAB_0019baf5;
                  }
                }
              }
LAB_0019baf9:
              iVar26 = iVar26 + 1;
            }
            iVar27 = iVar27 + 1;
            paVar34 = paVar34 + 7;
          } while (iVar27 < iVar32);
        }
        mNoOmit = (u16)uVar25;
        pWVar17 = pWVar17->pOuter;
      } while (pWVar17 != (WhereClause *)0x0);
    }
    pIdxInfo->nConstraint = iVar26;
    if (0 < (int)uVar40) {
      lVar35 = 0;
      iVar13 = 0;
      do {
        pEVar23 = *(Expr **)((long)&pEVar10->a[0].pExpr + lVar35);
        local_68.u.pNC = (NameContext *)&DAT_aaaaaaaaaaaaaaaa;
        local_68.xSelectCallback2 = (_func_void_Walker_ptr_Select_ptr *)&DAT_aaaaaaaaaaaaaaaa;
        local_68.walkerDepth = -0x55555556;
        local_68.eCode = 1;
        local_68.mWFlags = 0xaaaa;
        local_68.pParse = (Parse *)0x0;
        local_68.xExprCallback = exprNodeIsConstant;
        local_68.xSelectCallback = sqlite3SelectWalkFail;
        if (pEVar23 != (Expr *)0x0) {
          sqlite3WalkExprNN(&local_68,pEVar23);
        }
        if (local_68.eCode == 0) {
          psVar3[iVar13].iColumn = (int)pEVar23->iColumn;
          *(byte *)((long)&pIdxInfo[1].aConstraintUsage + (long)iVar13 * 8 + lVar18 * 0x14 + 4) =
               (&pEVar10->a[0].fg.sortFlags)[lVar35] & 1;
          iVar13 = iVar13 + 1;
        }
        lVar35 = lVar35 + 0x18;
      } while (lVar19 * 0x18 != lVar35);
    }
    pIdxInfo->nOrderBy = iVar13;
  }
  if (pIdxInfo == (sqlite3_index_info *)0x0) {
    iVar13 = 7;
  }
  else {
    p->rSetup = 0;
    p->wsFlags = 0x400;
    p->nLTerm = 0;
    pbVar2 = (byte *)((long)&p->u + 4);
    *pbVar2 = *pbVar2 & 0xfe;
    uVar40 = pIdxInfo->nConstraint;
    iVar26 = whereLoopResize(pParse->db,p,uVar40);
    iVar13 = 7;
    if (iVar26 == 0) {
      iVar13 = whereLoopAddVirtualOne
                         (pBuilder,mPrereq,0xffffffffffffffff,0,pIdxInfo,mNoOmit,&bIn,&bRetry);
      if (bRetry != 0) {
        iVar13 = whereLoopAddVirtualOne
                           (pBuilder,mPrereq,0xffffffffffffffff,0,pIdxInfo,mNoOmit,&bIn,(int *)0x0);
      }
      if (iVar13 == 0) {
        uVar30 = ~mPrereq;
        uVar41 = p->prereq & uVar30;
        iVar13 = 0;
        if (bIn != 0 || uVar41 != 0) {
          if (bIn == 0) {
            bVar42 = false;
            local_98 = 0;
            iVar13 = 0;
          }
          else {
            iVar13 = whereLoopAddVirtualOne
                               (pBuilder,mPrereq,0xffffffffffffffff,1,pIdxInfo,mNoOmit,&bIn,
                                (int *)0x0);
            local_98 = p->prereq & uVar30;
            bVar42 = local_98 == 0;
          }
          uVar24 = 0;
          bVar16 = bVar42;
          do {
            if (iVar13 != 0) break;
            if ((int)uVar40 < 1) {
              uVar15 = 0xffffffffffffffff;
            }
            else {
              uVar15 = 0xffffffffffffffff;
              uVar28 = 0;
              do {
                iVar13 = pIdxInfo->aConstraint[uVar28].iTermOffset;
                pWVar17 = pWVar8;
                iVar26 = pWVar8->nTerm;
                if (pWVar8->nTerm <= iVar13) {
                  do {
                    iVar13 = iVar13 - iVar26;
                    pWVar17 = pWVar17->pOuter;
                    iVar26 = pWVar17->nTerm;
                  } while (iVar26 <= iVar13);
                }
                uVar31 = pWVar17->a[iVar13].prereqRight & uVar30;
                uVar33 = uVar15;
                if (uVar31 < uVar15) {
                  uVar33 = uVar31;
                }
                if (uVar24 < uVar31) {
                  uVar15 = uVar33;
                }
                uVar28 = uVar28 + 1;
              } while (uVar28 != uVar40);
            }
            iVar13 = 0;
            if ((((uVar15 != 0xffffffffffffffff) && (uVar15 != uVar41)) &&
                (iVar13 = 0, uVar15 != local_98)) &&
               ((iVar13 = whereLoopAddVirtualOne
                                    (pBuilder,mPrereq,uVar15 | mPrereq,0,pIdxInfo,mNoOmit,&bIn,
                                     (int *)0x0), p->prereq == mPrereq && (bVar42 = true, bIn == 0))
               )) {
              bVar16 = true;
            }
            uVar24 = uVar15;
          } while (uVar15 != 0xffffffffffffffff);
          if (!bVar42 && iVar13 == 0) {
            iVar13 = whereLoopAddVirtualOne
                               (pBuilder,mPrereq,mPrereq,0,pIdxInfo,mNoOmit,&bIn,(int *)0x0);
            if (bIn == 0) {
              bVar16 = true;
            }
          }
          if (!bVar16 && iVar13 == 0) {
            iVar13 = whereLoopAddVirtualOne
                               (pBuilder,mPrereq,mPrereq,1,pIdxInfo,mNoOmit,&bIn,(int *)0x0);
          }
        }
      }
    }
    freeIndexInfo(pParse->db,pIdxInfo);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar13;
  }
  __stack_chk_fail();
}

Assistant:

static int whereLoopAddVirtual(
  WhereLoopBuilder *pBuilder,  /* WHERE clause information */
  Bitmask mPrereq,             /* Tables that must be scanned before this one */
  Bitmask mUnusable            /* Tables that must be scanned after this one */
){
  int rc = SQLITE_OK;          /* Return code */
  WhereInfo *pWInfo;           /* WHERE analysis context */
  Parse *pParse;               /* The parsing context */
  WhereClause *pWC;            /* The WHERE clause */
  SrcItem *pSrc;               /* The FROM clause term to search */
  sqlite3_index_info *p;       /* Object to pass to xBestIndex() */
  int nConstraint;             /* Number of constraints in p */
  int bIn;                     /* True if plan uses IN(...) operator */
  WhereLoop *pNew;
  Bitmask mBest;               /* Tables used by best possible plan */
  u16 mNoOmit;
  int bRetry = 0;              /* True to retry with LIMIT/OFFSET disabled */

  assert( (mPrereq & mUnusable)==0 );
  pWInfo = pBuilder->pWInfo;
  pParse = pWInfo->pParse;
  pWC = pBuilder->pWC;
  pNew = pBuilder->pNew;
  pSrc = &pWInfo->pTabList->a[pNew->iTab];
  assert( IsVirtual(pSrc->pSTab) );
  p = allocateIndexInfo(pWInfo, pWC, mUnusable, pSrc, &mNoOmit);
  if( p==0 ) return SQLITE_NOMEM_BKPT;
  pNew->rSetup = 0;
  pNew->wsFlags = WHERE_VIRTUALTABLE;
  pNew->nLTerm = 0;
  pNew->u.vtab.needFree = 0;
  nConstraint = p->nConstraint;
  if( whereLoopResize(pParse->db, pNew, nConstraint) ){
    freeIndexInfo(pParse->db, p);
    return SQLITE_NOMEM_BKPT;
  }

  /* First call xBestIndex() with all constraints usable. */
  WHERETRACE(0x800, ("BEGIN %s.addVirtual()\n", pSrc->pSTab->zName));
  WHERETRACE(0x800, ("  VirtualOne: all usable\n"));
  rc = whereLoopAddVirtualOne(
      pBuilder, mPrereq, ALLBITS, 0, p, mNoOmit, &bIn, &bRetry
  );
  if( bRetry ){
    assert( rc==SQLITE_OK );
    rc = whereLoopAddVirtualOne(
        pBuilder, mPrereq, ALLBITS, 0, p, mNoOmit, &bIn, 0
    );
  }

  /* If the call to xBestIndex() with all terms enabled produced a plan
  ** that does not require any source tables (IOW: a plan with mBest==0)
  ** and does not use an IN(...) operator, then there is no point in making
  ** any further calls to xBestIndex() since they will all return the same
  ** result (if the xBestIndex() implementation is sane). */
  if( rc==SQLITE_OK && ((mBest = (pNew->prereq & ~mPrereq))!=0 || bIn) ){
    int seenZero = 0;             /* True if a plan with no prereqs seen */
    int seenZeroNoIN = 0;         /* Plan with no prereqs and no IN(...) seen */
    Bitmask mPrev = 0;
    Bitmask mBestNoIn = 0;

    /* If the plan produced by the earlier call uses an IN(...) term, call
    ** xBestIndex again, this time with IN(...) terms disabled. */
    if( bIn ){
      WHERETRACE(0x800, ("  VirtualOne: all usable w/o IN\n"));
      rc = whereLoopAddVirtualOne(
          pBuilder, mPrereq, ALLBITS, WO_IN, p, mNoOmit, &bIn, 0);
      assert( bIn==0 );
      mBestNoIn = pNew->prereq & ~mPrereq;
      if( mBestNoIn==0 ){
        seenZero = 1;
        seenZeroNoIN = 1;
      }
    }

    /* Call xBestIndex once for each distinct value of (prereqRight & ~mPrereq)
    ** in the set of terms that apply to the current virtual table.  */
    while( rc==SQLITE_OK ){
      int i;
      Bitmask mNext = ALLBITS;
      assert( mNext>0 );
      for(i=0; i<nConstraint; i++){
        int iTerm = p->aConstraint[i].iTermOffset;
        Bitmask mThis = termFromWhereClause(pWC, iTerm)->prereqRight & ~mPrereq;
        if( mThis>mPrev && mThis<mNext ) mNext = mThis;
      }
      mPrev = mNext;
      if( mNext==ALLBITS ) break;
      if( mNext==mBest || mNext==mBestNoIn ) continue;
      WHERETRACE(0x800, ("  VirtualOne: mPrev=%04llx mNext=%04llx\n",
                       (sqlite3_uint64)mPrev, (sqlite3_uint64)mNext));
      rc = whereLoopAddVirtualOne(
          pBuilder, mPrereq, mNext|mPrereq, 0, p, mNoOmit, &bIn, 0);
      if( pNew->prereq==mPrereq ){
        seenZero = 1;
        if( bIn==0 ) seenZeroNoIN = 1;
      }
    }

    /* If the calls to xBestIndex() in the above loop did not find a plan
    ** that requires no source tables at all (i.e. one guaranteed to be
    ** usable), make a call here with all source tables disabled */
    if( rc==SQLITE_OK && seenZero==0 ){
      WHERETRACE(0x800, ("  VirtualOne: all disabled\n"));
      rc = whereLoopAddVirtualOne(
          pBuilder, mPrereq, mPrereq, 0, p, mNoOmit, &bIn, 0);
      if( bIn==0 ) seenZeroNoIN = 1;
    }

    /* If the calls to xBestIndex() have so far failed to find a plan
    ** that requires no source tables at all and does not use an IN(...)
    ** operator, make a final call to obtain one here.  */
    if( rc==SQLITE_OK && seenZeroNoIN==0 ){
      WHERETRACE(0x800, ("  VirtualOne: all disabled and w/o IN\n"));
      rc = whereLoopAddVirtualOne(
          pBuilder, mPrereq, mPrereq, WO_IN, p, mNoOmit, &bIn, 0);
    }
  }

  freeIndexInfo(pParse->db, p);
  WHERETRACE(0x800, ("END %s.addVirtual(), rc=%d\n", pSrc->pSTab->zName, rc));
  return rc;
}